

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O2

void __thiscall rpc_tests::rpc_parse_monetary_values::test_method(rpc_parse_monetary_values *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  CAmount *pCVar3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  check_type cVar6;
  undefined8 *puVar4;
  undefined8 *puVar5;
  char *local_8e8;
  char *local_8e0;
  undefined1 *local_8d8;
  undefined1 *local_8d0;
  char *local_8c8;
  char *local_8c0;
  undefined1 *local_8b8;
  undefined1 *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_868;
  char *local_860;
  undefined1 *local_858;
  undefined1 *local_850;
  char *local_848;
  char *local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  char *local_828;
  char *local_820;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  undefined1 *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  char *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined8 local_1b8;
  allocator<char> local_1a9;
  CAmount local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  string local_d0;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a0;
  undefined1 local_90 [16];
  undefined1 *local_80;
  char *local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x119;
  file.m_begin = (iterator)&local_100;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_110,msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"-0.00000001",(allocator<char> *)&local_d0);
  ValueFromString((UniValue *)local_90,(string *)local_b0);
  AmountFromValue((UniValue *)local_90,8);
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)local_b0);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0x119;
  file_00.m_begin = (iterator)&local_120;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_130,
             msg_00);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffffffffff00;
  local_b0._8_8_ = (element_type *)0x0;
  aStack_a0._M_allocated_capacity = 0;
  local_90[8] = false;
  local_90._0_8_ = &PTR__lazy_ostream_0113b0d0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = "exception UniValue expected but not raised";
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_138 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_b0,(lazy_ostream *)local_90,1,1,WARN,_cVar6,
             (size_t)&local_140,0x119);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_a0._M_allocated_capacity);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  file_01.m_end = (iterator)0x11a;
  file_01.m_begin = (iterator)&local_180;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_190,
             msg_01);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_198 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"0",&local_1a9);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  local_1b8 = 0;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (local_b0,&local_1a0,0x11a,1,2,pCVar3,"AmountFromValue(ValueFromString(\"0\"))",
             &local_1b8,"0LL");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)pCVar3;
  msg_02.m_begin = pvVar1;
  file_02.m_end = (iterator)0x11b;
  file_02.m_begin = (iterator)&local_1c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1d8,
             msg_02);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1e0 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"0.00000000",&local_1a9);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  local_1b8 = 0;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (local_b0,&local_1e8,0x11b,1,2,pCVar3,"AmountFromValue(ValueFromString(\"0.00000000\"))"
             ,&local_1b8,"0LL");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)pCVar3;
  msg_03.m_begin = pvVar1;
  file_03.m_end = (iterator)0x11c;
  file_03.m_begin = (iterator)&local_1f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_208,
             msg_03);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_210 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"0.00000001",&local_1a9);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  local_1b8 = 1;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (local_b0,&local_218,0x11c,1,2,pCVar3,"AmountFromValue(ValueFromString(\"0.00000001\"))"
             ,&local_1b8,"1LL");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)pCVar3;
  msg_04.m_begin = pvVar1;
  file_04.m_end = (iterator)0x11d;
  file_04.m_begin = (iterator)&local_228;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_238,
             msg_04);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_240 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"0.17622195",&local_1a9);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  local_1b8 = 0x10ce4b3;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (local_b0,&local_248,0x11d,1,2,pCVar3,"AmountFromValue(ValueFromString(\"0.17622195\"))"
             ,&local_1b8,"17622195LL");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)pCVar3;
  msg_05.m_begin = pvVar1;
  file_05.m_end = (iterator)0x11e;
  file_05.m_begin = (iterator)&local_258;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_268,
             msg_05);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_270 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"0.5",&local_1a9);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  local_1b8 = 50000000;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (local_b0,&local_278,0x11e,1,2,pCVar3,"AmountFromValue(ValueFromString(\"0.5\"))",
             &local_1b8,"50000000LL");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)pCVar3;
  msg_06.m_begin = pvVar1;
  file_06.m_end = (iterator)0x11f;
  file_06.m_begin = (iterator)&local_288;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_298,
             msg_06);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2a0 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"0.50000000",&local_1a9);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  local_1b8 = 50000000;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (local_b0,&local_2a8,0x11f,1,2,pCVar3,"AmountFromValue(ValueFromString(\"0.50000000\"))"
             ,&local_1b8,"50000000LL");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)pCVar3;
  msg_07.m_begin = pvVar1;
  file_07.m_end = (iterator)0x120;
  file_07.m_begin = (iterator)&local_2b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2c8,
             msg_07);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2d0 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"0.89898989",&local_1a9);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  local_1b8 = 0x55bbfed;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (local_b0,&local_2d8,0x120,1,2,pCVar3,"AmountFromValue(ValueFromString(\"0.89898989\"))"
             ,&local_1b8,"89898989LL");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)pCVar3;
  msg_08.m_begin = pvVar1;
  file_08.m_end = (iterator)0x121;
  file_08.m_begin = (iterator)&local_2e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2f8,
             msg_08);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_300 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"1.00000000",&local_1a9);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  local_1b8 = 100000000;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (local_b0,&local_308,0x121,1,2,pCVar3,"AmountFromValue(ValueFromString(\"1.00000000\"))"
             ,&local_1b8,"100000000LL");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)pCVar3;
  msg_09.m_begin = pvVar1;
  file_09.m_end = (iterator)0x122;
  file_09.m_begin = (iterator)&local_318;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_328,
             msg_09);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_330 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"20999999.9999999",&local_1a9);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  local_1b8 = 0x775f05a073ff6;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (local_b0,&local_338,0x122,1,2,pCVar3,
             "AmountFromValue(ValueFromString(\"20999999.9999999\"))",&local_1b8,
             "2099999999999990LL");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = (iterator)pCVar3;
  msg_10.m_begin = pvVar1;
  file_10.m_end = (iterator)0x123;
  file_10.m_begin = (iterator)&local_348;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_358,
             msg_10);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_360 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"20999999.99999999",&local_1a9);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  local_1b8 = 2099999999999999;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (local_b0,&local_368,0x123,1,2,pCVar3,
             "AmountFromValue(ValueFromString(\"20999999.99999999\"))",&local_1b8,
             "2099999999999999LL");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = (iterator)pCVar3;
  msg_11.m_begin = pvVar1;
  file_11.m_end = (iterator)0x125;
  file_11.m_begin = (iterator)&local_378;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_388,
             msg_11);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_390 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"1e-8",&local_1a9);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  local_1b8 = 1;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_b0,&local_398,0x125,1,2,pCVar3,"AmountFromValue(ValueFromString(\"1e-8\"))",
             &local_1b8,"COIN/100000000");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = (iterator)pCVar3;
  msg_12.m_begin = pvVar1;
  file_12.m_end = (iterator)0x126;
  file_12.m_begin = (iterator)&local_3a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3b8,
             msg_12);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3c0 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"0.1e-7",&local_1a9);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  local_1b8 = 1;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_b0,&local_3c8,0x126,1,2,pCVar3,"AmountFromValue(ValueFromString(\"0.1e-7\"))",
             &local_1b8,"COIN/100000000");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = (iterator)pCVar3;
  msg_13.m_begin = pvVar1;
  file_13.m_end = (iterator)0x127;
  file_13.m_begin = (iterator)&local_3d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3e8,
             msg_13);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3f0 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"0.01e-6",&local_1a9);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  local_1b8 = 1;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_b0,&local_3f8,0x127,1,2,pCVar3,"AmountFromValue(ValueFromString(\"0.01e-6\"))",
             &local_1b8,"COIN/100000000");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = (iterator)pCVar3;
  msg_14.m_begin = pvVar1;
  file_14.m_end = (iterator)0x128;
  file_14.m_begin = (iterator)&local_408;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_418,
             msg_14);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_420 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"0.00000000000000000000000000000000000001e+30",&local_1a9);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  local_1b8 = CONCAT44(local_1b8._4_4_,1);
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_b0,&local_428,0x128,1,2,pCVar3,
             "AmountFromValue(ValueFromString(\"0.00000000000000000000000000000000000001e+30\"))",
             &local_1b8,"1");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = (iterator)pCVar3;
  msg_15.m_begin = pvVar1;
  file_15.m_end = (iterator)0x129;
  file_15.m_begin = (iterator)&local_438;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_448,
             msg_15);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_450 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "0.0000000000000000000000000000000000000000000000000000000000000000000000000001e+68",
             &local_1a9);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  local_1b8 = 1;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_b0,&local_458,0x129,1,2,pCVar3,
             "AmountFromValue(ValueFromString(\"0.0000000000000000000000000000000000000000000000000000000000000000000000000001e+68\"))"
             ,&local_1b8,"COIN/100000000");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = (iterator)pCVar3;
  msg_16.m_begin = pvVar1;
  file_16.m_end = (iterator)0x12a;
  file_16.m_begin = (iterator)&local_468;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_478,
             msg_16);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_480 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "10000000000000000000000000000000000000000000000000000000000000000e-64",
             (allocator<char> *)&local_1b8);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_b0,&local_488,0x12a,1,2,pCVar3,
             "AmountFromValue(ValueFromString(\"10000000000000000000000000000000000000000000000000000000000000000e-64\"))"
             ,&COIN,"COIN");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = (iterator)pCVar3;
  msg_17.m_begin = pvVar1;
  file_17.m_end = (iterator)0x12b;
  file_17.m_begin = (iterator)&local_498;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_4a8,
             msg_17);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4b0 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "0.000000000000000000000000000000000000000000000000000000000000000100000000000000000000000000000000000000000000000000000e64"
             ,(allocator<char> *)&local_1b8);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  puVar4 = &COIN;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_b0,&local_4b8,299,1,2,pCVar3,
             "AmountFromValue(ValueFromString(\"0.000000000000000000000000000000000000000000000000000000000000000100000000000000000000000000000000000000000000000000000e64\"))"
             ,&COIN,"COIN");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  puVar5 = &local_1b8;
  msg_18.m_end = (iterator)pCVar3;
  msg_18.m_begin = pvVar1;
  file_18.m_end = (iterator)0x12d;
  file_18.m_begin = (iterator)&local_4c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_4d8,
             msg_18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"1e-9",(allocator<char> *)&local_d0);
  ValueFromString((UniValue *)local_90,(string *)local_b0);
  AmountFromValue((UniValue *)local_90,8);
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)local_b0);
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = (iterator)pCVar3;
  msg_19.m_begin = pvVar1;
  file_19.m_end = (iterator)0x12d;
  file_19.m_begin = (iterator)&local_4e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_4f8,
             msg_19);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffffffffff00;
  local_b0._8_8_ = (element_type *)0x0;
  aStack_a0._M_allocated_capacity = 0;
  local_90[8] = false;
  local_90._0_8_ = &PTR__lazy_ostream_0113b0d0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = "exception UniValue expected but not raised";
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_500 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_b0,(lazy_ostream *)local_90,1,1,WARN,(check_type)puVar4,
             (size_t)&local_508,0x12d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_a0._M_allocated_capacity);
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = pvVar2;
  msg_20.m_begin = pvVar1;
  file_20.m_end = (iterator)0x12e;
  file_20.m_begin = (iterator)&local_548;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_558,
             msg_20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"0.000000019",(allocator<char> *)&local_d0);
  ValueFromString((UniValue *)local_90,(string *)local_b0);
  AmountFromValue((UniValue *)local_90,8);
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)local_b0);
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = pvVar2;
  msg_21.m_begin = pvVar1;
  file_21.m_end = (iterator)0x12e;
  file_21.m_begin = (iterator)&local_568;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_578,
             msg_21);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffffffffff00;
  local_b0._8_8_ = (element_type *)0x0;
  aStack_a0._M_allocated_capacity = 0;
  local_90[8] = false;
  local_90._0_8_ = &PTR__lazy_ostream_0113b0d0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = "exception UniValue expected but not raised";
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_580 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_b0,(lazy_ostream *)local_90,1,1,WARN,(check_type)puVar4,
             (size_t)&local_588,0x12e);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_a0._M_allocated_capacity);
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = pvVar2;
  msg_22.m_begin = pvVar1;
  file_22.m_end = (iterator)0x12f;
  file_22.m_begin = (iterator)&local_5c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_5d8,
             msg_22);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5e0 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"0.00000001000000",&local_1a9);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  local_1b8 = 1;
  pvVar1 = (iterator)0x2;
  puVar4 = puVar5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (local_b0,&local_5e8,0x12f,1,2,pCVar3,
             "AmountFromValue(ValueFromString(\"0.00000001000000\"))",puVar5,"1LL");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_23.m_end = (iterator)pCVar3;
  msg_23.m_begin = pvVar1;
  file_23.m_end = (iterator)0x130;
  file_23.m_begin = (iterator)&local_5f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_608,
             msg_23);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"19e-9",(allocator<char> *)&local_d0);
  ValueFromString((UniValue *)local_90,(string *)local_b0);
  AmountFromValue((UniValue *)local_90,8);
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)local_b0);
  local_618 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_24.m_end = (iterator)pCVar3;
  msg_24.m_begin = pvVar1;
  file_24.m_end = (iterator)0x130;
  file_24.m_begin = (iterator)&local_618;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_628,
             msg_24);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffffffffff00;
  local_b0._8_8_ = (element_type *)0x0;
  aStack_a0._M_allocated_capacity = 0;
  local_90[8] = false;
  local_90._0_8_ = &PTR__lazy_ostream_0113b0d0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = "exception UniValue expected but not raised";
  local_638 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_630 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_b0,(lazy_ostream *)local_90,1,1,WARN,(check_type)puVar4,
             (size_t)&local_638,0x130);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_a0._M_allocated_capacity);
  local_678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_25.m_end = pvVar2;
  msg_25.m_begin = pvVar1;
  file_25.m_end = (iterator)0x131;
  file_25.m_begin = (iterator)&local_678;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_688,
             msg_25);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  aStack_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_690 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"0.19e-6",&local_1a9);
  ValueFromString((UniValue *)local_90,&local_d0);
  local_1a8 = AmountFromValue((UniValue *)local_90,8);
  pCVar3 = &local_1a8;
  local_1b8 = CONCAT44(local_1b8._4_4_,0x13);
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_b0,&local_698,0x131,1,2,pCVar3,"AmountFromValue(ValueFromString(\"0.19e-6\"))",
             puVar5,"19");
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  local_6a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_26.m_end = (iterator)pCVar3;
  msg_26.m_begin = pvVar1;
  file_26.m_end = (iterator)0x132;
  file_26.m_begin = (iterator)&local_6a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_6b8,
             msg_26);
  UniValue::UniValue<const_char_(&)[7],_char[7],_true>((UniValue *)local_90,(char (*) [7])0xbbe09c);
  AmountFromValue((UniValue *)local_90,8);
  UniValue::~UniValue((UniValue *)local_90);
  local_6c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_6c0 = "";
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_27.m_end = (iterator)pCVar3;
  msg_27.m_begin = pvVar1;
  file_27.m_end = (iterator)0x132;
  file_27.m_begin = (iterator)&local_6c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_6d8,
             msg_27);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffffffffff00;
  local_b0._8_8_ = (element_type *)0x0;
  aStack_a0._M_allocated_capacity = 0;
  local_90[8] = false;
  local_90._0_8_ = &PTR__lazy_ostream_0113b0d0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = "exception UniValue expected but not raised";
  local_6e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_6e0 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_b0,(lazy_ostream *)local_90,1,1,WARN,(check_type)puVar5,
             (size_t)&local_6e8,0x132);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_a0._M_allocated_capacity);
  local_728 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_720 = "";
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_28.m_end = pvVar2;
  msg_28.m_begin = pvVar1;
  file_28.m_end = (iterator)0x134;
  file_28.m_begin = (iterator)&local_728;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_738,
             msg_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"92233720368.54775808",(allocator<char> *)&local_d0);
  ValueFromString((UniValue *)local_90,(string *)local_b0);
  AmountFromValue((UniValue *)local_90,8);
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)local_b0);
  local_748 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_740 = "";
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_29.m_end = pvVar2;
  msg_29.m_begin = pvVar1;
  file_29.m_end = (iterator)0x134;
  file_29.m_begin = (iterator)&local_748;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_758,
             msg_29);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffffffffff00;
  local_b0._8_8_ = (element_type *)0x0;
  aStack_a0._M_allocated_capacity = 0;
  local_90[8] = false;
  local_90._0_8_ = &PTR__lazy_ostream_0113b0d0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = "exception UniValue expected but not raised";
  local_768 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_760 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_b0,(lazy_ostream *)local_90,1,1,WARN,(check_type)puVar5,
             (size_t)&local_768,0x134);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_a0._M_allocated_capacity);
  local_7a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_7a0 = "";
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_30.m_end = pvVar2;
  msg_30.m_begin = pvVar1;
  file_30.m_end = (iterator)0x135;
  file_30.m_begin = (iterator)&local_7a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_7b8,
             msg_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"1e+11",(allocator<char> *)&local_d0);
  ValueFromString((UniValue *)local_90,(string *)local_b0);
  AmountFromValue((UniValue *)local_90,8);
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)local_b0);
  local_7c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_7c0 = "";
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_31.m_end = pvVar2;
  msg_31.m_begin = pvVar1;
  file_31.m_end = (iterator)0x135;
  file_31.m_begin = (iterator)&local_7c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_7d8,
             msg_31);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffffffffff00;
  local_b0._8_8_ = (element_type *)0x0;
  aStack_a0._M_allocated_capacity = 0;
  local_90[8] = false;
  local_90._0_8_ = &PTR__lazy_ostream_0113b0d0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = "exception UniValue expected but not raised";
  local_7e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_7e0 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_b0,(lazy_ostream *)local_90,1,1,WARN,(check_type)puVar5,
             (size_t)&local_7e8,0x135);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_a0._M_allocated_capacity);
  local_828 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_820 = "";
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_32.m_end = pvVar2;
  msg_32.m_begin = pvVar1;
  file_32.m_end = (iterator)0x136;
  file_32.m_begin = (iterator)&local_828;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_838,
             msg_32);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"1e11",(allocator<char> *)&local_d0);
  ValueFromString((UniValue *)local_90,(string *)local_b0);
  AmountFromValue((UniValue *)local_90,8);
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)local_b0);
  local_848 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_840 = "";
  local_858 = &boost::unit_test::basic_cstring<char_const>::null;
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_33.m_end = pvVar2;
  msg_33.m_begin = pvVar1;
  file_33.m_end = (iterator)0x136;
  file_33.m_begin = (iterator)&local_848;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_858,
             msg_33);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffffffffff00;
  local_b0._8_8_ = (element_type *)0x0;
  aStack_a0._M_allocated_capacity = 0;
  local_90[8] = false;
  local_90._0_8_ = &PTR__lazy_ostream_0113b0d0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = "exception UniValue expected but not raised";
  local_868 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_860 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_b0,(lazy_ostream *)local_90,1,1,WARN,(check_type)puVar5,
             (size_t)&local_868,0x136);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_a0._M_allocated_capacity);
  local_8a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_8a0 = "";
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_34.m_end = pvVar2;
  msg_34.m_begin = pvVar1;
  file_34.m_end = (iterator)0x137;
  file_34.m_begin = (iterator)&local_8a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_8b8,
             msg_34);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"93e+9",(allocator<char> *)&local_d0);
  ValueFromString((UniValue *)local_90,(string *)local_b0);
  AmountFromValue((UniValue *)local_90,8);
  UniValue::~UniValue((UniValue *)local_90);
  std::__cxx11::string::~string((string *)local_b0);
  local_8c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_8c0 = "";
  local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_35.m_end = pvVar2;
  msg_35.m_begin = pvVar1;
  file_35.m_end = (iterator)0x137;
  file_35.m_begin = (iterator)&local_8c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_8d8,
             msg_35);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffffffffff00;
  local_b0._8_8_ = (element_type *)0x0;
  aStack_a0._M_allocated_capacity = 0;
  local_90[8] = false;
  local_90._0_8_ = &PTR__lazy_ostream_0113b0d0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = "exception UniValue expected but not raised";
  local_8e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_8e0 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_b0,(lazy_ostream *)local_90,1,1,WARN,(check_type)puVar5,
             (size_t)&local_8e8,0x137);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_a0._M_allocated_capacity);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_parse_monetary_values)
{
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("-0.00000001")), UniValue);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0")), 0LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.00000000")), 0LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.00000001")), 1LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.17622195")), 17622195LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.5")), 50000000LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.50000000")), 50000000LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.89898989")), 89898989LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("1.00000000")), 100000000LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("20999999.9999999")), 2099999999999990LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("20999999.99999999")), 2099999999999999LL);

    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("1e-8")), COIN/100000000);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.1e-7")), COIN/100000000);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.01e-6")), COIN/100000000);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.00000000000000000000000000000000000001e+30")), 1);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.0000000000000000000000000000000000000000000000000000000000000000000000000001e+68")), COIN/100000000);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("10000000000000000000000000000000000000000000000000000000000000000e-64")), COIN);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.000000000000000000000000000000000000000000000000000000000000000100000000000000000000000000000000000000000000000000000e64")), COIN);

    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("1e-9")), UniValue); //should fail
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("0.000000019")), UniValue); //should fail
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.00000001000000")), 1LL); //should pass, cut trailing 0
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("19e-9")), UniValue); //should fail
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.19e-6")), 19); //should pass, leading 0 is present
    BOOST_CHECK_EXCEPTION(AmountFromValue(".19e-6"), UniValue, HasJSON(R"({"code":-3,"message":"Invalid amount"})")); //should fail, no leading 0

    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("92233720368.54775808")), UniValue); //overflow error
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("1e+11")), UniValue); //overflow error
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("1e11")), UniValue); //overflow error signless
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("93e+9")), UniValue); //overflow error
}